

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::IsImplicitWeakField
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  long lVar1;
  bool bVar2;
  FileOptions_OptimizeMode FVar3;
  int iVar4;
  Descriptor *pDVar5;
  SCC *pSVar6;
  SCC *pSVar7;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  
  if (options->lite_implicit_weak_fields != true) {
    return false;
  }
  FVar3 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),options,(bool *)0x0);
  if (FVar3 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    return false;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_20,&local_28);
  }
  if (field[2] != (FieldDescriptor)0xb) {
    return false;
  }
  if (((byte)field[1] & 0x60) == 0x40) {
    return false;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_20 = FieldDescriptor::TypeOnceInit;
    local_28 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_20,&local_28);
    if (field[2] != (FieldDescriptor)0xb) goto LAB_0023e152;
  }
  bVar2 = FieldDescriptor::is_map_message_type(field);
  if (bVar2) {
    return false;
  }
LAB_0023e152:
  if ((((byte)field[1] & 8) == 0) &&
     ((lVar1 = *(long *)(field + 0x28), lVar1 == 0 || ((byte)field[1] & 0x10) == 0 ||
      ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))))) {
    pDVar5 = FieldDescriptor::message_type(field);
    bVar2 = IsWellKnownMessage(*(FileDescriptor **)(pDVar5 + 0x10));
    if (!bVar2) {
      pDVar5 = FieldDescriptor::message_type(field);
      iVar4 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar5 + 0x10));
      if (iVar4 != 0) {
        pSVar6 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                 GetSCC(&scc_analyzer->analyzer_,*(Descriptor **)(field + 0x20));
        pDVar5 = FieldDescriptor::message_type(field);
        pSVar7 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                 GetSCC(&scc_analyzer->analyzer_,pDVar5);
        return pSVar6 != pSVar7;
      }
    }
  }
  return false;
}

Assistant:

bool UsingImplicitWeakFields(const FileDescriptor* file,
                             const Options& options) {
  return options.lite_implicit_weak_fields &&
         GetOptimizeFor(file, options) == FileOptions::LITE_RUNTIME;
}